

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O3

void ImGui_ImplSDL2_Shutdown(void)

{
  long lVar1;
  
  g_Window = (SDL_Window *)0x0;
  if (g_ClipboardTextData != (char *)0x0) {
    SDL_free();
  }
  g_ClipboardTextData = (char *)0x0;
  lVar1 = 0;
  do {
    SDL_FreeCursor(*(undefined8 *)((long)g_MouseCursors + lVar1));
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  g_MouseCursors[6] = (SDL_Cursor *)0x0;
  g_MouseCursors[7] = (SDL_Cursor *)0x0;
  g_MouseCursors[4] = (SDL_Cursor *)0x0;
  g_MouseCursors[5] = (SDL_Cursor *)0x0;
  g_MouseCursors[2] = (SDL_Cursor *)0x0;
  g_MouseCursors[3] = (SDL_Cursor *)0x0;
  g_MouseCursors[0] = (SDL_Cursor *)0x0;
  g_MouseCursors[1] = (SDL_Cursor *)0x0;
  return;
}

Assistant:

void ImGui_ImplSDL2_Shutdown()
{
    g_Window = NULL;

    // Destroy last known clipboard data
    if (g_ClipboardTextData)
        SDL_free(g_ClipboardTextData);
    g_ClipboardTextData = NULL;

    // Destroy SDL mouse cursors
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        SDL_FreeCursor(g_MouseCursors[cursor_n]);
    memset(g_MouseCursors, 0, sizeof(g_MouseCursors));
}